

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescriptorSetLayout.cpp
# Opt level: O2

void __thiscall
myvk::DescriptorBindingFlagGroup::Initialize
          (DescriptorBindingFlagGroup *this,
          vector<std::pair<VkDescriptorSetLayoutBinding,_unsigned_int>,_std::allocator<std::pair<VkDescriptorSetLayoutBinding,_unsigned_int>_>_>
          *binding_flags)

{
  pointer pVVar1;
  pointer puVar2;
  pointer ppVar3;
  pair<VkDescriptorSetLayoutBinding,_unsigned_int> *i;
  pointer __x;
  
  pVVar1 = (this->m_bindings).
           super__Vector_base<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_bindings).
      super__Vector_base<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>
      ._M_impl.super__Vector_impl_data._M_finish != pVVar1) {
    (this->m_bindings).
    super__Vector_base<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>.
    _M_impl.super__Vector_impl_data._M_finish = pVVar1;
  }
  puVar2 = (this->m_flags).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_flags).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (this->m_flags).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  ppVar3 = (binding_flags->
           super__Vector_base<std::pair<VkDescriptorSetLayoutBinding,_unsigned_int>,_std::allocator<std::pair<VkDescriptorSetLayoutBinding,_unsigned_int>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (__x = (binding_flags->
             super__Vector_base<std::pair<VkDescriptorSetLayoutBinding,_unsigned_int>,_std::allocator<std::pair<VkDescriptorSetLayoutBinding,_unsigned_int>_>_>
             )._M_impl.super__Vector_impl_data._M_start; __x != ppVar3; __x = __x + 1) {
    std::vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>::
    push_back(&this->m_bindings,&__x->first);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->m_flags,&__x->second)
    ;
  }
  return;
}

Assistant:

void DescriptorBindingFlagGroup::Initialize(
    const std::vector<std::pair<VkDescriptorSetLayoutBinding, VkDescriptorBindingFlags>> &binding_flags) {
	m_bindings.clear();
	m_flags.clear();
	for (const auto &i : binding_flags) {
		m_bindings.push_back(i.first);
		m_flags.push_back(i.second);
	}
}